

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# density_test_common.h
# Opt level: O2

string * __thiscall
density_tests::
truncated_type_name<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>>
          (string *__return_storage_ptr__,density_tests *this,size_t i_max_size)

{
  char *__ptr;
  char *pcVar1;
  int status;
  allocator local_2d;
  int local_2c;
  
  local_2c = 0;
  __ptr = (char *)__cxa_demangle("N7density14lf_heter_queueINS_12runtime_typeIJEEEN13density_tests26UnmovableFastTestAllocatorILm256EEELNS_23concurrency_cardinalityE1ELS6_0ELNS_17consistency_modelE0EEE"
                                 ,0,0,&local_2c);
  pcVar1 = 
  "N7density14lf_heter_queueINS_12runtime_typeIJEEEN13density_tests26UnmovableFastTestAllocatorILm256EEELNS_23concurrency_cardinalityE1ELS6_0ELNS_17consistency_modelE0EEE"
  ;
  if (local_2c == 0) {
    pcVar1 = __ptr;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_2d);
  if (this < (density_tests *)__return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

std::string truncated_type_name(size_t i_max_size = 80)
    {
#if defined(__GNUC__) && !defined(_MSC_VER)
        int         status    = 0;
        auto const  demangled = abi::__cxa_demangle(typeid(TYPE).name(), 0, 0, &status);
        std::string name      = status == 0 ? demangled : typeid(TYPE).name();
#else
        std::string name = typeid(TYPE).name();
#endif

        if (name.size() > i_max_size)
            name.resize(i_max_size);

#if defined(__GNUC__) && !defined(_MSC_VER)
        free(demangled);
#endif
        return name;
    }